

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deserializer.hpp
# Opt level: O1

void __thiscall
duckdb::Deserializer::ReadPropertyWithDefault<duckdb::vector<duckdb::BlockPointer,true>>
          (Deserializer *this,field_id_t field_id,char *tag,vector<duckdb::BlockPointer,_true> *ret)

{
  pointer pBVar1;
  pointer pBVar2;
  int iVar3;
  int iVar4;
  undefined4 extraout_var;
  undefined6 in_register_00000032;
  long lVar5;
  BlockPointer BVar6;
  vector<duckdb::BlockPointer,_std::allocator<duckdb::BlockPointer>_> local_58;
  BlockPointer local_40;
  
  iVar3 = (*this->_vptr_Deserializer[4])(this,CONCAT62(in_register_00000032,field_id));
  if ((byte)iVar3 == 0) {
    pBVar2 = (ret->super_vector<duckdb::BlockPointer,_std::allocator<duckdb::BlockPointer>_>).
             super__Vector_base<duckdb::BlockPointer,_std::allocator<duckdb::BlockPointer>_>._M_impl
             .super__Vector_impl_data._M_start;
    (ret->super_vector<duckdb::BlockPointer,_std::allocator<duckdb::BlockPointer>_>).
    super__Vector_base<duckdb::BlockPointer,_std::allocator<duckdb::BlockPointer>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    (ret->super_vector<duckdb::BlockPointer,_std::allocator<duckdb::BlockPointer>_>).
    super__Vector_base<duckdb::BlockPointer,_std::allocator<duckdb::BlockPointer>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    (ret->super_vector<duckdb::BlockPointer,_std::allocator<duckdb::BlockPointer>_>).
    super__Vector_base<duckdb::BlockPointer,_std::allocator<duckdb::BlockPointer>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  }
  else {
    local_58.super__Vector_base<duckdb::BlockPointer,_std::allocator<duckdb::BlockPointer>_>._M_impl
    .super__Vector_impl_data._M_start = (pointer)0x0;
    local_58.super__Vector_base<duckdb::BlockPointer,_std::allocator<duckdb::BlockPointer>_>._M_impl
    .super__Vector_impl_data._M_finish = (pointer)0x0;
    local_58.super__Vector_base<duckdb::BlockPointer,_std::allocator<duckdb::BlockPointer>_>._M_impl
    .super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    iVar4 = (*this->_vptr_Deserializer[8])(this);
    lVar5 = CONCAT44(extraout_var,iVar4);
    if (lVar5 != 0) {
      do {
        (*this->_vptr_Deserializer[6])(this);
        BVar6 = BlockPointer::Deserialize(this);
        (*this->_vptr_Deserializer[7])(this);
        local_40 = BVar6;
        if (local_58.super__Vector_base<duckdb::BlockPointer,_std::allocator<duckdb::BlockPointer>_>
            ._M_impl.super__Vector_impl_data._M_finish ==
            local_58.super__Vector_base<duckdb::BlockPointer,_std::allocator<duckdb::BlockPointer>_>
            ._M_impl.super__Vector_impl_data._M_end_of_storage) {
          ::std::vector<duckdb::BlockPointer,_std::allocator<duckdb::BlockPointer>_>::
          _M_realloc_insert<duckdb::BlockPointer>
                    (&local_58,
                     (iterator)
                     local_58.
                     super__Vector_base<duckdb::BlockPointer,_std::allocator<duckdb::BlockPointer>_>
                     ._M_impl.super__Vector_impl_data._M_finish,&local_40);
        }
        else {
          local_40.block_id = BVar6.block_id;
          local_40._8_8_ = BVar6._8_8_;
          (local_58.super__Vector_base<duckdb::BlockPointer,_std::allocator<duckdb::BlockPointer>_>.
           _M_impl.super__Vector_impl_data._M_finish)->block_id = local_40.block_id;
          (local_58.super__Vector_base<duckdb::BlockPointer,_std::allocator<duckdb::BlockPointer>_>.
           _M_impl.super__Vector_impl_data._M_finish)->offset = local_40.offset;
          (local_58.super__Vector_base<duckdb::BlockPointer,_std::allocator<duckdb::BlockPointer>_>.
           _M_impl.super__Vector_impl_data._M_finish)->unused_padding = local_40.unused_padding;
          local_58.super__Vector_base<duckdb::BlockPointer,_std::allocator<duckdb::BlockPointer>_>.
          _M_impl.super__Vector_impl_data._M_finish =
               local_58.
               super__Vector_base<duckdb::BlockPointer,_std::allocator<duckdb::BlockPointer>_>.
               _M_impl.super__Vector_impl_data._M_finish + 1;
        }
        lVar5 = lVar5 + -1;
      } while (lVar5 != 0);
    }
    (*this->_vptr_Deserializer[9])(this);
    pBVar1 = (ret->super_vector<duckdb::BlockPointer,_std::allocator<duckdb::BlockPointer>_>).
             super__Vector_base<duckdb::BlockPointer,_std::allocator<duckdb::BlockPointer>_>._M_impl
             .super__Vector_impl_data._M_start;
    (ret->super_vector<duckdb::BlockPointer,_std::allocator<duckdb::BlockPointer>_>).
    super__Vector_base<duckdb::BlockPointer,_std::allocator<duckdb::BlockPointer>_>._M_impl.
    super__Vector_impl_data._M_start =
         local_58.super__Vector_base<duckdb::BlockPointer,_std::allocator<duckdb::BlockPointer>_>.
         _M_impl.super__Vector_impl_data._M_start;
    (ret->super_vector<duckdb::BlockPointer,_std::allocator<duckdb::BlockPointer>_>).
    super__Vector_base<duckdb::BlockPointer,_std::allocator<duckdb::BlockPointer>_>._M_impl.
    super__Vector_impl_data._M_finish =
         local_58.super__Vector_base<duckdb::BlockPointer,_std::allocator<duckdb::BlockPointer>_>.
         _M_impl.super__Vector_impl_data._M_finish;
    (ret->super_vector<duckdb::BlockPointer,_std::allocator<duckdb::BlockPointer>_>).
    super__Vector_base<duckdb::BlockPointer,_std::allocator<duckdb::BlockPointer>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage =
         local_58.super__Vector_base<duckdb::BlockPointer,_std::allocator<duckdb::BlockPointer>_>.
         _M_impl.super__Vector_impl_data._M_end_of_storage;
    local_58.super__Vector_base<duckdb::BlockPointer,_std::allocator<duckdb::BlockPointer>_>._M_impl
    .super__Vector_impl_data._M_start = (pointer)0x0;
    local_58.super__Vector_base<duckdb::BlockPointer,_std::allocator<duckdb::BlockPointer>_>._M_impl
    .super__Vector_impl_data._M_finish = (pointer)0x0;
    local_58.super__Vector_base<duckdb::BlockPointer,_std::allocator<duckdb::BlockPointer>_>._M_impl
    .super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    pBVar2 = local_58.
             super__Vector_base<duckdb::BlockPointer,_std::allocator<duckdb::BlockPointer>_>._M_impl
             .super__Vector_impl_data._M_start;
    if (pBVar1 != (pointer)0x0) {
      operator_delete(pBVar1);
      pBVar2 = local_58.
               super__Vector_base<duckdb::BlockPointer,_std::allocator<duckdb::BlockPointer>_>.
               _M_impl.super__Vector_impl_data._M_start;
    }
  }
  if (pBVar2 != (pointer)0x0) {
    operator_delete(pBVar2);
  }
  (*this->_vptr_Deserializer[5])(this,(ulong)(byte)iVar3);
  return;
}

Assistant:

inline void ReadPropertyWithDefault(const field_id_t field_id, const char *tag, T &ret) {
		if (!OnOptionalPropertyBegin(field_id, tag)) {
			ret = std::forward<T>(SerializationDefaultValue::GetDefault<T>());
			OnOptionalPropertyEnd(false);
			return;
		}
		ret = Read<T>();
		OnOptionalPropertyEnd(true);
	}